

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O1

void __thiscall AmsRouter::AmsRouter(AmsRouter *this,AmsNetId netId)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  
  (this->super_Router)._vptr_Router = (_func_int **)&PTR__AmsRouter_0013ab20;
  *(int *)(this->localAddr).b = netId.b._0_4_;
  *(short *)((this->localAddr).b + 4) = netId.b._4_2_;
  *(undefined8 *)((long)&(this->mutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mutex).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  lVar2 = 0;
  (this->mutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->mutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  std::_V2::condition_variable_any::condition_variable_any(&this->connection_attempt_events);
  p_Var1 = &(this->connection_attempts)._M_t._M_impl.super__Rb_tree_header;
  (this->connection_attempts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->connection_attempts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->connection_attempts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->connection_attempts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->connection_attempts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->connections)._M_h._M_buckets = &(this->connections)._M_h._M_single_bucket;
  (this->connections)._M_h._M_bucket_count = 1;
  (this->connections)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->connections)._M_h._M_element_count = 0;
  (this->connections)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->connections)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->connections)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->mapping)._M_t._M_impl.super__Rb_tree_header;
  (this->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  do {
    AmsPort::AmsPort((AmsPort *)(&(this->ports).field_0x0 + lVar2));
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x3000);
  return;
}

Assistant:

AmsRouter::AmsRouter(AmsNetId netId)
    : localAddr(netId)
{}